

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int plane_partition_num(int n)

{
  undefined4 *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  if (-1 < n) {
    uVar10 = (ulong)(uint)n;
    puVar1 = (undefined4 *)operator_new__(uVar10 * 4 + 4);
    *puVar1 = 1;
    if ((n != 0) && (puVar1[1] = 1, n != 1)) {
      uVar5 = 3;
      lVar6 = 2;
      do {
        puVar1[lVar6] = 0;
        uVar2 = 1;
        iVar3 = 0;
        iVar4 = 0;
        do {
          uVar9 = 1;
          iVar11 = 0;
          do {
            iVar7 = (int)uVar9;
            iVar8 = iVar7 * iVar7;
            if ((int)((uVar2 & 0xffffffff) % uVar9) != 0) {
              iVar8 = 0;
            }
            iVar11 = iVar11 + iVar8;
            uVar9 = (ulong)(iVar7 + 1);
          } while (iVar3 + iVar7 != 1);
          iVar4 = iVar4 + iVar11 * puVar1[lVar6 - uVar2];
          puVar1[lVar6] = iVar4;
          uVar2 = uVar2 + 1;
          iVar3 = iVar3 + -1;
        } while (uVar2 != uVar5);
        puVar1[lVar6] = iVar4 / (int)lVar6;
        lVar6 = lVar6 + 1;
        uVar5 = uVar5 + 1;
      } while (lVar6 != uVar10 + 1);
    }
    iVar3 = puVar1[uVar10];
    operator_delete__(puVar1);
    return iVar3;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"PLANE_PARTITION_NUM - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  0 <= N is required.\n");
  exit(1);
}

Assistant:

int plane_partition_num ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    PLANE_PARTITION_NUM returns the number of plane partitions of the integer N.
//
//  Discussion:
//
//    A plane partition of a positive integer N is a partition of N in which
//    the parts have been arranged in a 2D array that is nonincreasing across
//    rows and columns.  There are six plane partitions of 3:
//
//      3   2 1   2   1 1 1   1 1   1
//                1           1     1
//                                  1
//
//  First Values:
//
//     N PP(N)
//     0    1
//     1    1
//     2    3
//     3    6
//     4   13
//     5   24
//     6   48
//     7   86
//     8  160
//     9  282
//    10  500
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Frank Olver, Daniel Lozier, Ronald Boisvert, Charles Clark,
//    NIST Handbook of Mathematical Functions,
//    Cambridge University Press, 2010,
//    ISBN: 978-0521140638,
//    LC: QA331.N57.
//  
//  Parameters:
//
//    Input, int N, the number, which must be at least 0.
//
//    Output, int PLANE_PARTITION_NUM, the number of 
//    plane partitions of N.
//
{
  int j;
  int k;
  int nn;
  int *pp;
  int s2;
  int value;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "PLANE_PARTITION_NUM - Fatal error!\n";
    std::cerr << "  0 <= N is required.\n";
    exit ( 1 );
  }

  pp = new int[n+1];
  nn = 0;
  pp[nn] = 1;

  nn = 1;
  if ( nn <= n )
  {
    pp[nn] = 1;
  }

  for ( nn = 2; nn <= n; nn++ )
  {
    pp[nn] = 0;
    for ( j = 1; j <= nn; j++ )
    {
      s2 = 0;
      for ( k = 1; k <= j; k++ )
      {
        if ( ( j % k ) == 0 )
        {
          s2 = s2 + k * k;
        }
      }
      pp[nn] = pp[nn] + pp[nn-j] * s2;
    }
    pp[nn] = pp[nn] / nn;
  }

  value = pp[n];

  delete [] pp;

  return value;
}